

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O2

void __thiscall
wasm::CoalesceLocalsWithLearning::pickIndices
          (CoalesceLocalsWithLearning *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  size_t *this_00;
  double dVar1;
  uint uVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  long *plVar3;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  undefined8 this_01;
  size_t sVar7;
  ulong uVar8;
  ulong __new_size;
  Order *pOVar9;
  ulong uVar10;
  Index i;
  uint uVar11;
  ulong uVar12;
  size_type __new_size_00;
  ulong uVar13;
  uint __tmp;
  long lVar14;
  int iVar15;
  bool *this_02;
  ulong uVar16;
  double dVar17;
  undefined1 local_27f8 [8];
  Generator generator;
  GeneticLearner<Order,_double,_Generator> learner;
  undefined1 auStack_78 [8];
  vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  mixtures;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  pointer local_38;
  
  sVar7 = Function::getNumVars
                    ((this->super_CoalesceLocals).
                     super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                     .
                     super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .
                     super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                     .
                     super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .currFunction);
  if (sVar7 < 2) {
    CoalesceLocals::pickIndices(&this->super_CoalesceLocals,indices);
    return;
  }
  sVar7 = Function::getNumVars
                    ((this->super_CoalesceLocals).
                     super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                     .
                     super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .
                     super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                     .
                     super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .currFunction);
  uVar11 = ((int)sVar7 + -1) * (int)sVar7;
  __new_size_00 = 0x14;
  if (uVar11 < 0x14) {
    __new_size_00 = (size_type)uVar11;
  }
  local_27f8 = (undefined1  [8])this;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)&generator,0x2a);
  generator.noise._M_p._0_1_ = 1;
  generator._5008_8_ = local_27f8;
  learner.generator = (Generator *)0x0;
  learner.population.
  super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  learner.population.
  super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)&learner.population.
             super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x539);
  std::
  vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  ::resize((vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
            *)&learner,__new_size_00);
  for (lVar14 = 0; __new_size_00 * 8 != lVar14; lVar14 = lVar14 + 8) {
    local_58._M_impl.super__Vector_impl_data._M_start =
         (pointer)pickIndices::Generator::makeRandom((Generator *)local_27f8);
    std::unique_ptr<Order,_std::default_delete<Order>_>::operator=
              ((unique_ptr<Order,_std::default_delete<Order>_> *)
               ((long)((learner.generator)->noise)._M_x + lVar14 + -8),
               (unique_ptr<Order,_std::default_delete<Order>_> *)&local_58);
    std::unique_ptr<Order,_std::default_delete<Order>_>::~unique_ptr
              ((unique_ptr<Order,_std::default_delete<Order>_> *)&local_58);
  }
  GeneticLearner<Order,_double,_Generator>::sort
            ((GeneticLearner<Order,_double,_Generator> *)&generator.first);
  dVar17 = (double)((learner.generator)->parent->super_CoalesceLocals).
                   super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                   .super_Pass.name._M_string_length;
  do {
    uVar13 = (long)learner.population.
                   super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)learner.generator >> 3;
    uVar8 = (uVar13 * 0x19) / 100;
    __new_size = (uVar13 * 0x32) / 100;
    auStack_78 = (undefined1  [8])0x0;
    mixtures.
    super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    mixtures.
    super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ::resize((vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
              *)auStack_78,__new_size);
    local_38 = (pointer)auStack_78;
    uVar10 = 0;
    while( true ) {
      this_01 = generator._5008_8_;
      this_02 = &generator.first;
      if (uVar10 == __new_size) break;
      sVar7 = GeneticLearner<Order,_double,_Generator>::randomIndex
                        ((GeneticLearner<Order,_double,_Generator> *)this_02);
      __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            ((learner.generator)->noise)._M_x[sVar7 - 1];
      sVar7 = GeneticLearner<Order,_double,_Generator>::randomIndex
                        ((GeneticLearner<Order,_double,_Generator> *)this_02);
      plVar3 = (long *)((learner.generator)->noise)._M_x[sVar7 - 1];
      uVar16 = (long)(__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar15 = (int)uVar16;
      uVar16 = uVar16 & 0xffffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,uVar16);
      for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
        *(int *)((long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         local_58._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start +
                (ulong)*(uint *)(*plVar3 + uVar12 * 4) * 4) = (int)uVar12;
      }
      pOVar9 = (Order *)operator_new(0x20);
      (pOVar9->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pOVar9->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pOVar9->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar9,__x);
      pOVar9->fitness =
           (double)__x[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
      if (iVar15 == 0) {
        __assert_fail("size >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                      ,699,
                      "Order *wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<Index> &)::Generator::makeMixture(Order *, Order *)"
                     );
      }
      uVar12 = Function::getNumParams(*(Function **)(*(long *)this_01 + 0x120));
      while (uVar11 = (uint)uVar12, uVar11 < iVar15 - 1U) {
        uVar16 = uVar12 & 0xffffffff;
        puVar4 = (pOVar9->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = puVar4[uVar16];
        uVar12 = (ulong)(uVar11 + 1);
        if (*(uint *)((long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              local_58._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start +
                     (ulong)puVar4[uVar16 + 1] * 4) <
            *(uint *)((long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              local_58._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (ulong)uVar2 * 4)) {
          puVar4[uVar16] = puVar4[uVar16 + 1];
          puVar4[uVar16 + 1] = uVar2;
          uVar12 = (ulong)(uVar11 + 2);
        }
      }
      pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator::
      calculateFitness(wasm::CoalesceLocalsWithLearning::
      pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order__
                ((void *)this_01,pOVar9);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
      this_00 = &learner.noise._M_p;
      learner.noise._M_p = (size_t)pOVar9;
      std::unique_ptr<Order,_std::default_delete<Order>_>::operator=
                (local_38 + uVar10,(unique_ptr<Order,_std::default_delete<Order>_> *)this_00);
      std::unique_ptr<Order,_std::default_delete<Order>_>::~unique_ptr
                ((unique_ptr<Order,_std::default_delete<Order>_> *)this_00);
      uVar10 = uVar10 + 1;
    }
    for (uVar10 = 0; __new_size != uVar10; uVar10 = uVar10 + 1) {
      pOVar9 = (Order *)((learner.generator)->noise)._M_x[uVar8 + (uVar10 - 1)];
      ((learner.generator)->noise)._M_x[uVar8 + (uVar10 - 1)] =
           (unsigned_long)
           local_38[uVar10]._M_t.super___uniq_ptr_impl<Order,_std::default_delete<Order>_>._M_t.
           super__Tuple_impl<0UL,_Order_*,_std::default_delete<Order>_>.
           super__Head_base<0UL,_Order_*,_false>._M_head_impl;
      local_38[uVar10]._M_t.super___uniq_ptr_impl<Order,_std::default_delete<Order>_>._M_t.
      super__Tuple_impl<0UL,_Order_*,_std::default_delete<Order>_>.
      super__Head_base<0UL,_Order_*,_false>._M_head_impl = pOVar9;
    }
    uVar8 = uVar8 + __new_size;
    lVar14 = uVar8 * 8;
    for (; uVar8 < uVar13; uVar8 = uVar8 + 1) {
      local_58._M_impl.super__Vector_impl_data._M_start =
           (pointer)pickIndices::Generator::makeRandom((Generator *)generator._5008_8_);
      std::unique_ptr<Order,_std::default_delete<Order>_>::operator=
                ((unique_ptr<Order,_std::default_delete<Order>_> *)
                 ((long)((learner.generator)->noise)._M_x + lVar14 + -8),
                 (unique_ptr<Order,_std::default_delete<Order>_> *)&local_58);
      std::unique_ptr<Order,_std::default_delete<Order>_>::~unique_ptr
                ((unique_ptr<Order,_std::default_delete<Order>_> *)&local_58);
      lVar14 = lVar14 + 8;
    }
    GeneticLearner<Order,_double,_Generator>::sort
              ((GeneticLearner<Order,_double,_Generator> *)this_02);
    std::
    vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ::~vector((vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
               *)auStack_78);
    dVar1 = (double)((learner.generator)->parent->super_CoalesceLocals).
                    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                    .super_Pass.name._M_string_length;
    bVar5 = NAN(dVar17);
    bVar6 = dVar1 == dVar17;
    dVar17 = dVar1;
    if ((bVar6) && (!NAN(dVar1) && !bVar5)) {
      CoalesceLocals::pickIndicesFromOrder
                (&this->super_CoalesceLocals,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(learner.generator)->parent,
                 indices);
      std::
      vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
      ::~vector((vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
                 *)&learner);
      return;
    }
  } while( true );
}

Assistant:

void CoalesceLocalsWithLearning::pickIndices(std::vector<Index>& indices) {
  if (getFunction()->getNumVars() <= 1) {
    // nothing to think about here
    CoalesceLocals::pickIndices(indices);
    return;
  }

  struct Order : public std::vector<Index> {
    void setFitness(double f) { fitness = f; }
    double getFitness() { return fitness; }
    void dump(std::string text) {
      std::cout << text + ": ( ";
      for (Index i = 0; i < size(); i++) {
        std::cout << (*this)[i] << " ";
      }
      std::cout << ")\n";
      std::cout << "of quality: " << getFitness() << "\n";
    }

  private:
    double fitness;
  };

  struct Generator {
    Generator(CoalesceLocalsWithLearning* parent) : parent(parent), noise(42) {}

    void calculateFitness(Order* order) {
      // apply the order
      std::vector<Index> indices; // the phenotype
      Index removedCopies;
      parent->pickIndicesFromOrder(*order, indices, removedCopies);
      auto maxIndex = *std::max_element(indices.begin(), indices.end());
      assert(maxIndex <= parent->numLocals);
      // main part of fitness is the number of locals
      double fitness = parent->numLocals - maxIndex; // higher fitness is better
      // secondarily, it is nice to not reorder locals unnecessarily
      double fragment = 1.0 / (2.0 * parent->numLocals);
      for (Index i = 0; i < parent->numLocals; i++) {
        if ((*order)[i] == i) {
          fitness += fragment; // boost for each that wasn't moved
        }
      }
      // removing copies is a secondary concern
      fitness = (100 * fitness) + removedCopies;
      order->setFitness(fitness);
    }

    Order* makeRandom() {
      auto* ret = new Order;
      ret->resize(parent->numLocals);
      for (Index i = 0; i < parent->numLocals; i++) {
        (*ret)[i] = i;
      }
      if (first) {
        // as the first guess, use the natural order. this is not arbitrary for
        // two reasons. first, there may be an inherent order in the input
        // (frequent indices are lower, etc.). second, by ensuring we start with
        // the natural order, we ensure we are at least as good as the
        // non-learning variant.
        // TODO: use ::pickIndices from the parent, so we literally get the
        //       simpler approach as our first option
        first = false;
      } else {
        // leave params alone, shuffle the rest
        std::shuffle(ret->begin() + parent->getFunction()->getNumParams(),
                     ret->end(),
                     noise);
      }
      calculateFitness(ret);
#ifdef CFG_LEARN_DEBUG
      order->dump("new rando");
#endif
      return ret;
    }

    Order* makeMixture(Order* left, Order* right) {
      // perturb left using right. this is useful since
      // we don't care about absolute locations, relative ones matter more,
      // and a true merge of two vectors could obscure that (e.g.
      // a.......... and ..........a would merge a into the middle, for no
      // reason), and cause a lot of unnecessary noise
      Index size = left->size();
      Order reverseRight; // reverseRight[x] is the index of x in right
      reverseRight.resize(size);
      for (Index i = 0; i < size; i++) {
        reverseRight[(*right)[i]] = i;
      }
      auto* ret = new Order;
      *ret = *left;
      assert(size >= 1);
      for (Index i = parent->getFunction()->getNumParams(); i < size - 1; i++) {
        // if (i, i + 1) is in reverse order in right, flip them
        if (reverseRight[(*ret)[i]] > reverseRight[(*ret)[i + 1]]) {
          std::swap((*ret)[i], (*ret)[i + 1]);
          // if we don't skip, we might end up pushing an element all the way to
          // the end, which is not very perturbation-y
          i++;
        }
      }
      calculateFitness(ret);
#ifdef CFG_LEARN_DEBUG
      ret->dump("new mixture");
#endif
      return ret;
    }

  private:
    CoalesceLocalsWithLearning* parent;
    std::mt19937 noise;
    bool first = true;
  };

#ifdef CFG_LEARN_DEBUG
  std::cout << "[learning for " << getFunction()->name << "]\n";
#endif
  auto numVars = this->getFunction()->getNumVars();
  const int GENERATION_SIZE =
    std::min(Index(numVars * (numVars - 1)), Index(20));
  Generator generator(this);
  GeneticLearner<Order, double, Generator> learner(generator, GENERATION_SIZE);
#ifdef CFG_LEARN_DEBUG
  learner.getBest()->dump("first best");
#endif
  // keep working while we see improvement
  auto oldBest = learner.getBest()->getFitness();
  while (1) {
    learner.runGeneration();
    auto newBest = learner.getBest()->getFitness();
    if (newBest == oldBest) {
      break; // unlikely we can improve
    }
    oldBest = newBest;
#ifdef CFG_LEARN_DEBUG
    learner.getBest()->dump("current best");
#endif
  }
#ifdef CFG_LEARN_DEBUG
  learner.getBest()->dump("the best");
#endif
  // TODO: cache indices in Orders, at the cost of more memory?
  this->pickIndicesFromOrder(*learner.getBest(), indices);
}